

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapUniq.c
# Opt level: O0

int Amap_LibFindNode(Amap_Lib_t *pLib,int iFan0,int iFan1,int fXor)

{
  Vec_Int_t *pVVar1;
  int fXor_local;
  int iFan1_local;
  int iFan0_local;
  Amap_Lib_t *pLib_local;
  
  if (fXor == 0) {
    pVVar1 = (Vec_Int_t *)Vec_PtrEntry(pLib->vRules,iFan0);
    pLib_local._4_4_ = Vec_IntCheckWithMask(pVVar1,iFan1);
  }
  else {
    pVVar1 = (Vec_Int_t *)Vec_PtrEntry(pLib->vRulesX,iFan0);
    pLib_local._4_4_ = Vec_IntCheckWithMask(pVVar1,iFan1);
  }
  return pLib_local._4_4_;
}

Assistant:

int Amap_LibFindNode( Amap_Lib_t * pLib, int iFan0, int iFan1, int fXor )
{
    if ( fXor )
        return Vec_IntCheckWithMask( (Vec_Int_t *)Vec_PtrEntry(pLib->vRulesX, iFan0), iFan1 );
    else
        return Vec_IntCheckWithMask( (Vec_Int_t *)Vec_PtrEntry(pLib->vRules, iFan0), iFan1 );
}